

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise1d.cpp
# Opt level: O0

void __thiscall
ncnn::DeconvolutionDepthWise1D::cut_padding
          (DeconvolutionDepthWise1D *this,Mat *top_blob_bordered,Mat *top_blob,Option *opt)

{
  int *piVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int wcut;
  int iVar2;
  int left;
  int bottom;
  int top;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Mat *in_stack_ffffffffffffffd0;
  Option *in_stack_ffffffffffffffe0;
  
  left = (int)((ulong)in_RSI >> 0x20);
  top = (int)((ulong)in_RDI >> 0x20);
  iVar2 = (int)in_RSI;
  bottom = (int)in_RDI;
  if ((*(int *)(in_RDI + 0xe0) < 1) && (*(int *)(in_RDI + 0xe4) < 1)) {
    if (*(int *)(in_RDI + 0xec) < 1) {
      if (in_RDX != in_RSI) {
        if (in_RSI[1] != 0) {
          LOCK();
          *(int *)in_RSI[1] = *(int *)in_RSI[1] + 1;
          UNLOCK();
        }
        if (in_RDX[1] != 0) {
          piVar1 = (int *)in_RDX[1];
          LOCK();
          iVar2 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (iVar2 == 1) {
            if (in_RDX[4] == 0) {
              if ((void *)*in_RDX != (void *)0x0) {
                free((void *)*in_RDX);
              }
            }
            else {
              (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
            }
          }
        }
        *in_RDX = 0;
        in_RDX[2] = 0;
        *(undefined4 *)(in_RDX + 3) = 0;
        *(undefined4 *)(in_RDX + 5) = 0;
        *(undefined4 *)((long)in_RDX + 0x2c) = 0;
        *(undefined4 *)(in_RDX + 6) = 0;
        *(undefined4 *)((long)in_RDX + 0x34) = 0;
        *(undefined4 *)(in_RDX + 7) = 0;
        in_RDX[8] = 0;
        in_RDX[1] = 0;
        *in_RDX = *in_RSI;
        in_RDX[1] = in_RSI[1];
        in_RDX[2] = in_RSI[2];
        *(undefined4 *)(in_RDX + 3) = *(undefined4 *)(in_RSI + 3);
        in_RDX[4] = in_RSI[4];
        *(undefined4 *)(in_RDX + 5) = *(undefined4 *)(in_RSI + 5);
        *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)in_RSI + 0x2c);
        *(undefined4 *)(in_RDX + 6) = *(undefined4 *)(in_RSI + 6);
        *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)in_RSI + 0x34);
        *(undefined4 *)(in_RDX + 7) = *(undefined4 *)(in_RSI + 7);
        in_RDX[8] = in_RSI[8];
      }
    }
    else if ((*(int *)(in_RDI + 0xe0) == -0xe9) || (*(int *)(in_RDI + 0xe4) == -0xe9)) {
      copy_cut_border(in_stack_ffffffffffffffd0,
                      (Mat *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),top,
                      bottom,left,iVar2,in_stack_ffffffffffffffe0);
    }
    else if ((*(int *)(in_RDI + 0xe0) == -0xea) || (*(int *)(in_RDI + 0xe4) == -0xea)) {
      copy_cut_border(in_stack_ffffffffffffffd0,
                      (Mat *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),top,
                      bottom,left,iVar2,in_stack_ffffffffffffffe0);
    }
  }
  else {
    copy_cut_border(in_stack_ffffffffffffffd0,
                    (Mat *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),top,bottom,
                    left,iVar2,in_stack_ffffffffffffffe0);
  }
  return;
}

Assistant:

void DeconvolutionDepthWise1D::cut_padding(const Mat& top_blob_bordered, Mat& top_blob, const Option& opt) const
{
    if (pad_left > 0 || pad_right > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, 0, 0, pad_left, pad_right, opt);
    }
    else if (output_w > 0)
    {
        int wcut = top_blob_bordered.w - output_w;

        if (pad_left == -233 || pad_right == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border(top_blob_bordered, top_blob, 0, 0, wcut / 2, wcut - wcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border(top_blob_bordered, top_blob, 0, 0, wcut - wcut / 2, wcut / 2, opt);
        }
    }
    else
    {
        top_blob = top_blob_bordered;
    }
}